

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O1

InfoStatus
getInfoIndex(HighsLogOptions *report_log_options,string *name,
            vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *index)

{
  pointer ppIVar1;
  pointer ppIVar2;
  pointer __s2;
  size_t sVar3;
  InfoRecord *pIVar4;
  size_t __n;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  ppIVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  *index = 0;
  uVar6 = (uint)((ulong)((long)ppIVar2 - (long)ppIVar1) >> 3);
  if (0 < (int)uVar6) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    uVar7 = 0;
    do {
      pIVar4 = ppIVar1[uVar7];
      __n = (pIVar4->name)._M_string_length;
      if (__n == sVar3) {
        if (__n == 0) {
          return kOk;
        }
        iVar5 = bcmp((pIVar4->name)._M_dataplus._M_p,__s2,__n);
        if (iVar5 == 0) {
          return kOk;
        }
      }
      uVar7 = uVar7 + 1;
      *index = (HighsInt)uVar7;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  highsLogUser(report_log_options,kError,"getInfoIndex: Info \"%s\" is unknown\n",
               (name->_M_dataplus)._M_p);
  return kUnknownInfo;
}

Assistant:

InfoStatus getInfoIndex(const HighsLogOptions& report_log_options,
                        const std::string& name,
                        const std::vector<InfoRecord*>& info_records,
                        HighsInt& index) {
  HighsInt num_info = info_records.size();
  for (index = 0; index < num_info; index++)
    if (info_records[index]->name == name) return InfoStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getInfoIndex: Info \"%s\" is unknown\n", name.c_str());
  return InfoStatus::kUnknownInfo;
}